

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fct_standard_logger__on_test_skip(fct_logger_i *logger_,fct_logger_evt_t *e)

{
  char *pcVar1;
  char *pcVar2;
  char *startwith;
  char msg [256];
  char acStack_118 [255];
  undefined1 local_19;
  
  pcVar1 = e->cndtn;
  pcVar2 = e->name;
  startwith = (char *)0x0;
  memset(acStack_118,0,0x100);
  fct_snprintf(acStack_118,(size_t)startwith,"%s (%s)",pcVar2,pcVar1);
  local_19 = 0;
  fct_dotted_line_start((size_t)acStack_118,startwith);
  fct_dotted_line_end("- SKIP -");
  return;
}

Assistant:

static void
fct_standard_logger__on_test_skip(
    fct_logger_i* logger_,
    fct_logger_evt_t const *e
)
{
    char const *condition = e->cndtn;
    char const *name = e->name;
    char msg[256] = {'\0'};
    fct_unused(logger_);
    fct_unused(condition);
    fct_snprintf(msg, sizeof(msg), "%s (%s)", name, condition);
    msg[sizeof(msg)-1] = '\0';
    fct_dotted_line_start(FCT_STANDARD_LOGGER_MAX_LINE, msg);
    fct_dotted_line_end("- SKIP -");
}